

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void prvTidyReportMarkupVersion(TidyDocImpl *doc)

{
  uint vers;
  Bool BVar1;
  ctmbstr ptVar2;
  
  if (doc->givenDoctype != (tmbstr)0x0) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x278);
  }
  if (*(int *)((doc->config).value + 0x67) == 0) {
    BVar1 = doc->lexer->isvoyager;
    vers = prvTidyApparentVersion(doc);
    ptVar2 = prvTidyHTMLVersionNameFromCode(vers,BVar1);
    if (ptVar2 == (ctmbstr)0x0) {
      ptVar2 = tidyLocalizedString(0x1fb);
    }
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x276,ptVar2);
    BVar1 = prvTidyWarnMissingSIInEmittedDocType(doc);
    if (BVar1 != no) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27b);
      return;
    }
  }
  return;
}

Assistant:

void TY_(ReportMarkupVersion)( TidyDocImpl* doc )
{
    if ( doc->givenDoctype )
        TY_(Report)( doc, NULL, NULL, STRING_DOCTYPE_GIVEN, doc->givenDoctype );

    if ( ! cfgBool(doc, TidyXmlTags) )
    {
        Bool isXhtml = doc->lexer->isvoyager;
        uint apparentVers = TY_(ApparentVersion)( doc );
        ctmbstr vers = TY_(HTMLVersionNameFromCode)( apparentVers, isXhtml );

        if ( !vers )
            vers = tidyLocalizedString(STRING_HTML_PROPRIETARY);

        TY_(Report)( doc, NULL, NULL, STRING_CONTENT_LOOKS, vers );

        /* Warn about missing sytem identifier (SI) in emitted doctype */
        if ( TY_(WarnMissingSIInEmittedDocType)( doc ) )
            TY_(Report)( doc, NULL, NULL, STRING_NO_SYSID );
    }
}